

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

void __thiscall ClipperLib::Clipper::ProcessEdgesAtTopOfScanbeam(Clipper *this,cInt topY)

{
  size_t *psVar1;
  double dVar2;
  long lVar3;
  IntPoint OffPt;
  bool bVar4;
  long lVar5;
  OutPt *pOVar6;
  OutPt *pOVar7;
  TEdge *pTVar8;
  _List_node_base *p_Var9;
  TEdge *pTVar10;
  TEdge *pTVar11;
  IntPoint pt3;
  IntPoint pt3_00;
  IntPoint pt;
  TEdge *local_50;
  IntPoint local_48;
  MaximaList *local_38;
  
  pTVar10 = *(TEdge **)
             (this->_vptr_Clipper[-3] + 0x10 +
             (long)&(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>);
  local_50 = pTVar10;
  if (pTVar10 != (TEdge *)0x0) {
    local_38 = &this->m_Maxima;
    do {
      local_50 = pTVar10;
      if ((pTVar10->Top).Y == topY) {
        if (pTVar10->NextInLML != (TEdge *)0x0) {
LAB_00291515:
          if (((pTVar10->NextInLML == (TEdge *)0x0) ||
              (dVar2 = pTVar10->NextInLML->Dx, dVar2 != -1e+40)) || (NAN(dVar2))) {
            lVar5 = (pTVar10->Top).X;
            goto LAB_002915c3;
          }
          ClipperBase::UpdateEdgeIntoAEL
                    ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),
                     &local_50);
          pTVar10 = local_50;
          if (-1 < local_50->OutIdx) {
            AddOutPt(this,local_50,&local_50->Bot);
          }
          pTVar8 = this->m_SortedEdges;
          pTVar10->PrevInSEL = (TEdge *)0x0;
          if (pTVar8 != (TEdge *)0x0) {
            pTVar8->PrevInSEL = pTVar10;
          }
          this->m_SortedEdges = pTVar10;
          pTVar10->NextInSEL = pTVar8;
          goto LAB_002915cb;
        }
        pTVar8 = GetMaximaPairEx(pTVar10);
        if (((pTVar8 != (TEdge *)0x0) && (pTVar8->Dx == -1e+40)) && (!NAN(pTVar8->Dx)))
        goto LAB_00291515;
        if (this->m_StrictSimple == true) {
          p_Var9 = (_List_node_base *)operator_new(0x18);
          p_Var9[1]._M_next = (_List_node_base *)(pTVar10->Top).X;
          std::__detail::_List_node_base::_M_hook(p_Var9);
          psVar1 = &(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>._M_impl
                    ._M_node._M_size;
          *psVar1 = *psVar1 + 1;
        }
        pTVar8 = pTVar10->PrevInAEL;
        DoMaxima(this,pTVar10);
        if (pTVar8 == (TEdge *)0x0) {
          pTVar8 = (TEdge *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]);
        }
      }
      else {
        dVar2 = (double)(topY - (pTVar10->Bot).Y) * pTVar10->Dx;
        lVar5 = (long)(dVar2 + *(double *)(&DAT_002ef030 + (ulong)(dVar2 < 0.0) * 8)) +
                (pTVar10->Bot).X;
LAB_002915c3:
        (pTVar10->Curr).X = lVar5;
        (pTVar10->Curr).Y = topY;
LAB_002915cb:
        pTVar8 = pTVar10;
        if (((this->m_StrictSimple == true) && (-1 < pTVar10->OutIdx)) &&
           ((pTVar11 = pTVar10->PrevInAEL, pTVar11 != (TEdge *)0x0 && pTVar10->WindDelta != 0 &&
            (((-1 < pTVar11->OutIdx && ((pTVar11->Curr).X == (pTVar10->Curr).X)) &&
             (pTVar11->WindDelta != 0)))))) {
          local_48.X = (pTVar10->Curr).X;
          local_48.Y = (pTVar10->Curr).Y;
          pOVar6 = AddOutPt(this,pTVar11,&local_48);
          pOVar7 = AddOutPt(this,pTVar10,&local_48);
          OffPt.Y = local_48.Y;
          OffPt.X = local_48.X;
          AddJoin(this,pOVar6,pOVar7,OffPt);
          pTVar8 = local_50;
        }
      }
      pTVar10 = pTVar8->NextInAEL;
      local_50 = pTVar10;
    } while (pTVar10 != (TEdge *)0x0);
  }
  std::__cxx11::list<long_long,_std::allocator<long_long>_>::sort(&this->m_Maxima);
  ProcessHorizontals(this);
  std::__cxx11::list<long_long,_std::allocator<long_long>_>::clear(&this->m_Maxima);
  pTVar10 = *(TEdge **)
             (this->_vptr_Clipper[-3] + 0x10 +
             (long)&(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>);
  do {
    if (pTVar10 == (TEdge *)0x0) {
      return;
    }
    if (((pTVar10->Top).Y == topY) && (pTVar10->NextInLML != (TEdge *)0x0)) {
      local_50 = pTVar10;
      if (pTVar10->OutIdx < 0) {
        pOVar6 = (OutPt *)0x0;
      }
      else {
        pOVar6 = AddOutPt(this,pTVar10,&pTVar10->Top);
      }
      ClipperBase::UpdateEdgeIntoAEL
                ((ClipperBase *)((long)&this->_vptr_Clipper + (long)this->_vptr_Clipper[-3]),
                 &local_50);
      pTVar10 = local_50;
      pTVar8 = local_50->NextInAEL;
      pTVar11 = local_50->PrevInAEL;
      if (((pTVar11 == (TEdge *)0x0) || (lVar5 = (pTVar11->Curr).X, lVar5 != (local_50->Bot).X)) ||
         ((pOVar6 == (OutPt *)0x0 ||
          (((lVar3 = (pTVar11->Curr).Y, lVar3 != (local_50->Bot).Y || (pTVar11->OutIdx < 0)) ||
           (lVar3 <= (pTVar11->Top).Y)))))) {
LAB_002917fc:
        if (((pTVar8 != (TEdge *)0x0) && (lVar5 = (pTVar8->Curr).X, lVar5 == (pTVar10->Bot).X)) &&
           ((pOVar6 != (OutPt *)0x0 &&
            (((lVar3 = (pTVar8->Curr).Y, lVar3 == (pTVar10->Bot).Y && (-1 < pTVar8->OutIdx)) &&
             ((pTVar8->Top).Y < lVar3)))))) {
          pt3_00.Y = lVar3;
          pt3_00.X = lVar5;
          bVar4 = SlopesEqual(pTVar10->Curr,pTVar10->Top,pt3_00,pTVar8->Top,
                              (bool)(this->_vptr_Clipper[-3] + 8)
                                    [(long)&(this->m_GhostJoins).
                                            super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                                    ]);
          if (((bVar4) && (pTVar10->WindDelta != 0)) && (pTVar11 = pTVar8, pTVar8->WindDelta != 0))
          goto LAB_0029187f;
        }
      }
      else {
        pt3.Y = lVar3;
        pt3.X = lVar5;
        bVar4 = SlopesEqual(local_50->Curr,local_50->Top,pt3,pTVar11->Top,
                            (bool)(this->_vptr_Clipper[-3] + 8)
                                  [(long)&(this->m_GhostJoins).
                                          super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>
                                  ]);
        if (((!bVar4) || (pTVar10->WindDelta == 0)) || (pTVar11->WindDelta == 0)) goto LAB_002917fc;
LAB_0029187f:
        pOVar7 = AddOutPt(this,pTVar11,&pTVar10->Bot);
        AddJoin(this,pOVar6,pOVar7,pTVar10->Top);
      }
    }
    pTVar10 = pTVar10->NextInAEL;
  } while( true );
}

Assistant:

void Clipper::ProcessEdgesAtTopOfScanbeam(const cInt topY)
{
  TEdge* e = m_ActiveEdges;
  while( e )
  {
    //1. process maxima, treating them as if they're 'bent' horizontal edges,
    //   but exclude maxima with horizontal edges. nb: e can't be a horizontal.
    bool IsMaximaEdge = IsMaxima(e, topY);

    if(IsMaximaEdge)
    {
      TEdge* eMaxPair = GetMaximaPairEx(e);
      IsMaximaEdge = (!eMaxPair || !IsHorizontal(*eMaxPair));
    }

    if(IsMaximaEdge)
    {
      if (m_StrictSimple) m_Maxima.push_back(e->Top.X);
      TEdge* ePrev = e->PrevInAEL;
      DoMaxima(e);
      if( !ePrev ) e = m_ActiveEdges;
      else e = ePrev->NextInAEL;
    }
    else
    {
      //2. promote horizontal edges, otherwise update Curr.X and Curr.Y ...
      if (IsIntermediate(e, topY) && IsHorizontal(*e->NextInLML))
      {
        UpdateEdgeIntoAEL(e);
        if (e->OutIdx >= 0)
          AddOutPt(e, e->Bot);
        AddEdgeToSEL(e);
      } 
      else
      {
        e->Curr.X = TopX( *e, topY );
        e->Curr.Y = topY;
#ifdef use_xyz
		e->Curr.Z = topY == e->Top.Y ? e->Top.Z : (topY == e->Bot.Y ? e->Bot.Z : 0);
#endif
	  }

      //When StrictlySimple and 'e' is being touched by another edge, then
      //make sure both edges have a vertex here ...
      if (m_StrictSimple)
      {  
        TEdge* ePrev = e->PrevInAEL;
        if ((e->OutIdx >= 0) && (e->WindDelta != 0) && ePrev && (ePrev->OutIdx >= 0) &&
          (ePrev->Curr.X == e->Curr.X) && (ePrev->WindDelta != 0))
        {
          IntPoint pt = e->Curr;
#ifdef use_xyz
          SetZ(pt, *ePrev, *e);
#endif
          OutPt* op = AddOutPt(ePrev, pt);
          OutPt* op2 = AddOutPt(e, pt);
          AddJoin(op, op2, pt); //StrictlySimple (type-3) join
        }
      }

      e = e->NextInAEL;
    }
  }

  //3. Process horizontals at the Top of the scanbeam ...
  m_Maxima.sort();
  ProcessHorizontals();
  m_Maxima.clear();

  //4. Promote intermediate vertices ...
  e = m_ActiveEdges;
  while(e)
  {
    if(IsIntermediate(e, topY))
    {
      OutPt* op = 0;
      if( e->OutIdx >= 0 ) 
        op = AddOutPt(e, e->Top);
      UpdateEdgeIntoAEL(e);

      //if output polygons share an edge, they'll need joining later ...
      TEdge* ePrev = e->PrevInAEL;
      TEdge* eNext = e->NextInAEL;
      if (ePrev && ePrev->Curr.X == e->Bot.X &&
        ePrev->Curr.Y == e->Bot.Y && op &&
        ePrev->OutIdx >= 0 && ePrev->Curr.Y > ePrev->Top.Y &&
        SlopesEqual(e->Curr, e->Top, ePrev->Curr, ePrev->Top, m_UseFullRange) &&
        (e->WindDelta != 0) && (ePrev->WindDelta != 0))
      {
        OutPt* op2 = AddOutPt(ePrev, e->Bot);
        AddJoin(op, op2, e->Top);
      }
      else if (eNext && eNext->Curr.X == e->Bot.X &&
        eNext->Curr.Y == e->Bot.Y && op &&
        eNext->OutIdx >= 0 && eNext->Curr.Y > eNext->Top.Y &&
        SlopesEqual(e->Curr, e->Top, eNext->Curr, eNext->Top, m_UseFullRange) &&
        (e->WindDelta != 0) && (eNext->WindDelta != 0))
      {
        OutPt* op2 = AddOutPt(eNext, e->Bot);
        AddJoin(op, op2, e->Top);
      }
    }
    e = e->NextInAEL;
  }
}